

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderPrimitiveIDFromFragmentShader::iterate
          (GeometryShaderPrimitiveIDFromFragmentShader *this)

{
  GLuint GVar1;
  GLuint GVar2;
  bool bVar3;
  int iVar4;
  GLuint GVar5;
  deUint32 dVar6;
  NotSupportedError *this_00;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  TestError *this_01;
  TestLog *this_02;
  MessageBuilder *pMVar9;
  float fVar10;
  float local_250;
  MessageBuilder local_220;
  uint local_9c;
  float local_98;
  uint n_channel;
  float expected_rgba [4];
  float rendered_rgba [4];
  GLuint primitiveID;
  GLuint row;
  GLubyte *data;
  GLuint column;
  GLuint x;
  GLubyte *data_row;
  GLuint y;
  int error;
  GLubyte *resultBuffer;
  GLuint sizeOfDataArray;
  Functions *gl;
  float epsilon;
  GeometryShaderPrimitiveIDFromFragmentShader *this_local;
  long lVar8;
  
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
               ,0x4d7);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar4 = (*pRVar7->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar4);
  GVar5 = (**(code **)(lVar8 + 0x3c8))();
  this->m_program_id = GVar5;
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glCreateProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                  ,0x4de);
  GVar5 = (**(code **)(lVar8 + 0x3f0))(0x8b31);
  this->m_vertex_shader_id = GVar5;
  GVar5 = (**(code **)(lVar8 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_geometry_shader_id = GVar5;
  GVar5 = (**(code **)(lVar8 + 0x3f0))(0x8b30);
  this->m_fragment_shader_id = GVar5;
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glCreateShader() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                  ,0x4e4);
  bVar3 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_program_id,this->m_fragment_shader_id,1,
                     &m_fragment_shader_code,this->m_geometry_shader_id,1,&m_geometry_shader_code,
                     this->m_vertex_shader_id,1,&m_vertex_shader_code,(bool *)0x0);
  if (bVar3) {
    (**(code **)(lVar8 + 0x6f8))(1,&this->m_texture_id);
    (**(code **)(lVar8 + 0xb8))(0xde1,this->m_texture_id);
    (**(code **)(lVar8 + 0x1380))
              (0xde1,this->m_texture_n_levels,0x8058,this->m_texture_width,this->m_texture_height);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"Error creating a texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                    ,0x4f2);
    (**(code **)(lVar8 + 0x6d0))(1,&this->m_fbo_id);
    (**(code **)(lVar8 + 0x78))(0x8ca9,this->m_fbo_id);
    (**(code **)(lVar8 + 0x6a0))(0x8ca9,0x8ce0,0xde1,this->m_texture_id,0);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"Error configuring framebuffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                    ,0x4f9);
    (**(code **)(lVar8 + 0x708))(1,&this->m_vao_id);
    (**(code **)(lVar8 + 0xd8))(this->m_vao_id);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"Error configuring a vertex array object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                    ,0x4ff);
    GVar5 = this->m_n_drawn_vertices;
    GVar1 = this->m_texture_n_components;
    (**(code **)(lVar8 + 0x6c8))(1,&this->m_vbo_id);
    (**(code **)(lVar8 + 0x40))(0x8892,this->m_vbo_id);
    (**(code **)(lVar8 + 0x150))(0x8892,GVar5 * GVar1 * 4,0,0x88e4);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"Could not set up a buffer object to hold vertex_position attribute data!"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                    ,0x509);
    (**(code **)(lVar8 + 0x1a00))(0,0,this->m_texture_width,this->m_texture_height);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glViewport() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                    ,0x50d);
    (**(code **)(lVar8 + 0x1c0))(0x3f800000,0x3f800000,0x3f800000);
    (**(code **)(lVar8 + 0x188))(0x4000);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"Could not clear the color buffer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                    ,0x513);
    (**(code **)(lVar8 + 0x1680))(this->m_program_id);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glUseProgram() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                    ,0x517);
    (**(code **)(lVar8 + 0x538))(0,0,this->m_n_drawn_vertices);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"Rendering failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                    ,0x51a);
    _y = operator_new__((ulong)(this->m_texture_width * this->m_texture_height *
                               this->m_texture_n_components));
    (**(code **)(lVar8 + 0x78))(0x8ca8);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    if (dVar6 != 0) {
      if (_y != (void *)0x0) {
        operator_delete__(_y);
      }
      _y = (void *)0x0;
      glu::checkError(dVar6,"glBindFramebuffer() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                      ,0x525);
    }
    (**(code **)(lVar8 + 0x1220))(0,0,this->m_texture_width,this->m_texture_height,0x1908,0x1401,_y)
    ;
    dVar6 = (**(code **)(lVar8 + 0x800))();
    if (dVar6 != 0) {
      if (_y != (void *)0x0) {
        operator_delete__(_y);
      }
      _y = (void *)0x0;
      glu::checkError(dVar6,"Reading pixels failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                      ,0x52f);
    }
    data_row._0_4_ = 0;
    do {
      if (this->m_texture_height <= (uint)data_row) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
        if (_y != (void *)0x0) {
          operator_delete__(_y);
        }
        return STOP;
      }
      GVar5 = this->m_texture_width;
      GVar1 = this->m_texture_n_components;
      for (data._4_4_ = 0; data._4_4_ < this->m_texture_width; data._4_4_ = data._4_4_ + 1) {
        GVar2 = this->m_texture_n_components;
        rendered_rgba[3] = (float)((uint)data_row / this->m_squareEdgeSize);
        rendered_rgba[2] =
             (float)(data._4_4_ / this->m_squareEdgeSize +
                    (int)rendered_rgba[3] * (this->m_texture_width / this->m_squareEdgeSize));
        memset(expected_rgba + 2,0,0x10);
        for (local_9c = 0; local_9c < 4; local_9c = local_9c + 1) {
          expected_rgba[(ulong)local_9c + 2] =
               (float)*(byte *)((long)_y +
                               (ulong)local_9c +
                               (ulong)(data._4_4_ * GVar2) + (ulong)((uint)data_row * GVar5 * GVar1)
                               ) / 255.0;
        }
        local_98 = (float)((uint)rendered_rgba[2] & 0x3f) * 0.015625;
        fVar10 = ::deFloatFloor((float)(uint)rendered_rgba[2] * 0.015625);
        n_channel = (uint)(fVar10 * 0.015625);
        expected_rgba[0] = (float)(uint)rendered_rgba[2] / 4096.0;
        local_250 = 1.0;
        if (((uint)rendered_rgba[2] & 1) != 0) {
          local_250 = 0.0;
        }
        expected_rgba[1] = local_250;
        fVar10 = de::abs<float>(expected_rgba[2] - local_98);
        if ((((0.00390625 < fVar10) ||
             (fVar10 = de::abs<float>(expected_rgba[3] - (float)n_channel), 0.00390625 < fVar10)) ||
            (fVar10 = de::abs<float>(rendered_rgba[0] - expected_rgba[0]), 0.00390625 < fVar10)) ||
           (fVar10 = de::abs<float>(rendered_rgba[1] - expected_rgba[1]), 0.00390625 < fVar10)) {
          this_02 = tcu::TestContext::getLog
                              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_220,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<(&local_220,(char (*) [15])"Primitive ID: ");
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(uint *)(rendered_rgba + 2));
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [14])"Rendered data");
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [8])0x2af8606);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,expected_rgba + 2);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a3caab);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,expected_rgba + 3);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a3caab);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,rendered_rgba);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a3caab);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,rendered_rgba + 1);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2b47c71);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (pMVar9,(char (*) [63])
                                     "exceeds allowed epsilon when compared to expected data equal ("
                             );
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_98);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a3caab);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(float *)&n_channel);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a3caab);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,expected_rgba);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a3caab);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,expected_rgba + 1);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2c156ab);
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_220);
          if (_y != (void *)0x0) {
            operator_delete__(_y);
          }
          tcu::TestContext::setTestResult
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Fail");
          return STOP;
        }
      }
      data_row._0_4_ = (uint)data_row + 1;
    } while( true );
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Program could not have been created sucessfully",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
             ,0x4ea);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderPrimitiveIDFromFragmentShader::iterate(void)
{
	const float epsilon = 1.0f / 256.0f;

	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create a program object */
	m_program_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed");

	/* Create shader objects */
	m_vertex_shader_id   = gl.createShader(GL_VERTEX_SHADER);
	m_geometry_shader_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_fragment_shader_id = gl.createShader(GL_FRAGMENT_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed");

	/* Build the program object */
	if (!buildProgram(m_program_id, m_fragment_shader_id, 1, &m_fragment_shader_code, m_geometry_shader_id, 1,
					  &m_geometry_shader_code, m_vertex_shader_id, 1, &m_vertex_shader_code))
	{
		TCU_FAIL("Program could not have been created sucessfully");
	}

	/* Create and configure a texture object we'll be rendering to */
	gl.genTextures(1, &m_texture_id);
	gl.bindTexture(GL_TEXTURE_2D, m_texture_id);
	gl.texStorage2D(GL_TEXTURE_2D, m_texture_n_levels, GL_RGBA8, m_texture_width, m_texture_height);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating a texture object!");

	/* Create and configure the framebuffer object */
	gl.genFramebuffers(1, &m_fbo_id);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_id);
	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture_id, 0 /* level */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring framebuffer object!");

	/* Create and bind a vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring a vertex array object");

	/* Set up a buffer object we will use to hold vertex_position attribute data */
	const glw::GLuint sizeOfDataArray =
		static_cast<glw::GLuint>(m_n_drawn_vertices * m_texture_n_components * sizeof(glw::GLfloat));

	gl.genBuffers(1, &m_vbo_id);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_vbo_id);
	gl.bufferData(GL_ARRAY_BUFFER, sizeOfDataArray, DE_NULL, GL_STATIC_DRAW);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a buffer object to hold vertex_position attribute data!");

	/* Set up the viewport */
	gl.viewport(0 /* x */, 0 /* y */, m_texture_width, m_texture_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() call failed");

	/* Clear the color buffer */
	gl.clearColor(1.0f, 1.0f, 1.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not clear the color buffer!");

	/* Render the test geometry */
	gl.useProgram(m_program_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed");

	gl.drawArrays(GL_POINTS, 0 /* first */, m_n_drawn_vertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed!");

	/* Read the rendered data */
	glw::GLubyte* resultBuffer = new glw::GLubyte[m_texture_width * m_texture_height * m_texture_n_components];

	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_id);
	int error = gl.getError();
	if (error != GL_NO_ERROR)
	{
		delete[] resultBuffer;
		resultBuffer = NULL;
		GLU_EXPECT_NO_ERROR(error, "glBindFramebuffer() call failed");
	}

	gl.readPixels(0 /* x */, 0 /* y */, m_texture_width, m_texture_height, GL_RGBA, GL_UNSIGNED_BYTE, resultBuffer);

	error = gl.getError();
	if (error != GL_NO_ERROR)
	{
		delete[] resultBuffer;
		resultBuffer = NULL;
		GLU_EXPECT_NO_ERROR(error, "Reading pixels failed!");
	}

	/* Loop over all pixels and compare the rendered data with reference values */
	for (glw::GLuint y = 0; y < m_texture_height; ++y)
	{
		glw::GLubyte* data_row = resultBuffer + y * m_texture_width * m_texture_n_components;

		for (glw::GLuint x = 0; x < m_texture_width; ++x)
		{
			glw::GLuint   column	  = (x / m_squareEdgeSize);
			glw::GLubyte* data		  = data_row + x * m_texture_n_components;
			glw::GLuint   row		  = (y / m_squareEdgeSize);
			glw::GLuint   primitiveID = column + (row * (m_texture_width / m_squareEdgeSize));

			/* Calculate expected and rendered pixel color */
			float rendered_rgba[4] = { 0 };
			float expected_rgba[4];

			for (unsigned int n_channel = 0; n_channel < 4 /* RGBA */; ++n_channel)
			{
				rendered_rgba[n_channel] = float(data[n_channel]) / 255.0f;
			}

			expected_rgba[0] = (glw::GLfloat)(primitiveID % 64) / 64.0f;
			expected_rgba[1] = deFloatFloor((glw::GLfloat)(primitiveID) / 64.0f) / 64.0f;
			expected_rgba[2] = (glw::GLfloat)(primitiveID) / 4096.0f;
			expected_rgba[3] = (((primitiveID % 2) == 0) ? 1.0f : 0.0f);

			/* Compare the data */
			if (de::abs(rendered_rgba[0] - expected_rgba[0]) > epsilon ||
				de::abs(rendered_rgba[1] - expected_rgba[1]) > epsilon ||
				de::abs(rendered_rgba[2] - expected_rgba[2]) > epsilon ||
				de::abs(rendered_rgba[3] - expected_rgba[3]) > epsilon)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Primitive ID: " << primitiveID << "Rendered data"
								   << "equal (" << rendered_rgba[0] << ", " << rendered_rgba[1] << ", "
								   << rendered_rgba[2] << ", " << rendered_rgba[3] << ") "
								   << "exceeds allowed epsilon when compared to expected data equal ("
								   << expected_rgba[0] << ", " << expected_rgba[1] << ", " << expected_rgba[2] << ", "
								   << expected_rgba[3] << ")." << tcu::TestLog::EndMessage;

				delete[] resultBuffer;
				resultBuffer = NULL;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			} /* if (rendered data is invalid) */
		}	 /* for (all columns) */
	}		  /* for (all rows) */

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	delete[] resultBuffer;
	resultBuffer = NULL;

	return STOP;
}